

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O2

bool __thiscall
gss::innards::Lackey::check_solution
          (Lackey *this,VertexToVertexMapping *m,bool partial,bool all_solutions,
          function<bool_(int,_int)> *deletion)

{
  _Head_base<0UL,_gss::innards::Lackey::Imp_*,_false> _Var1;
  __type _Var2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  istream *piVar7;
  long *plVar8;
  optional<int> oVar9;
  optional<int> oVar10;
  DisobedientLackeyError *pDVar11;
  undefined7 in_register_00000011;
  int iVar12;
  char *__s;
  int iVar13;
  string_view n_00;
  string_view n_01;
  int m_1;
  int n;
  string k;
  string v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string operation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock
            (&lock,&((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
                    external_solver_mutex);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  command._M_dataplus._M_p = (pointer)&command.field_2;
  (_Var1._M_head_impl)->number_of_calls = (_Var1._M_head_impl)->number_of_calls + 1;
  command._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,partial) == 0) {
    (_Var1._M_head_impl)->number_of_checks = (_Var1._M_head_impl)->number_of_checks + 1;
    __s = "F";
    if (all_solutions) {
      __s = "A";
    }
  }
  else if ((deletion->super__Function_base)._M_manager == (_Manager_type)0x0) {
    (_Var1._M_head_impl)->number_of_checks = (_Var1._M_head_impl)->number_of_checks + 1;
    __s = "C";
  }
  else {
    (_Var1._M_head_impl)->number_of_propagations = (_Var1._M_head_impl)->number_of_propagations + 1;
    __s = "P";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&command,__s);
  poVar5 = std::operator<<((ostream *)
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl
                            )->send_to,(string *)&command);
  poVar5 = std::operator<<(poVar5," ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  for (p_Var6 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<((ostream *)
                             &((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                              _M_head_impl)->send_to," ");
    InputGraph::vertex_name_abi_cxx11_
              (&operation,
               ((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
               pattern_graph,p_Var6[1]._M_color);
    poVar5 = std::operator<<(poVar5,(string *)&operation);
    poVar5 = std::operator<<(poVar5," ");
    InputGraph::vertex_name_abi_cxx11_
              (&response,
               ((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
               target_graph,*(int *)&p_Var6[1].field_0x4);
    std::operator<<(poVar5,(string *)&response);
    std::__cxx11::string::~string((string *)&response);
    std::__cxx11::string::~string((string *)&operation);
  }
  std::endl<char,std::char_traits<char>>
            ((ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
               .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->send_to);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  if ((*(byte *)((long)&(_Var1._M_head_impl)->field_0x48 +
                *(long *)(*(long *)&(_Var1._M_head_impl)->send_to + -0x18)) & 5) != 0) {
    pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&operation,"error giving lackey its orders",(allocator<char> *)&response);
    DisobedientLackeyError::DisobedientLackeyError(pDVar11,&operation);
    __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  operation._M_dataplus._M_p = (pointer)&operation.field_2;
  operation._M_string_length = 0;
  operation.field_2._M_local_buf[0] = '\0';
  piVar7 = std::operator>>((istream *)&(_Var1._M_head_impl)->read_from,(string *)&operation);
  if ((((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) ||
     (_Var2 = std::operator==(&operation,&command), !_Var2)) {
    pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::operator+(&local_190,"asked lackey to ",&command);
    std::operator+(&v,&local_190,", but it replied with \'");
    std::operator+(&k,&v,&operation);
    std::operator+(&response,&k,"\'");
    DisobedientLackeyError::DisobedientLackeyError(pDVar11,&response);
    __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  response._M_dataplus._M_p = (pointer)&response.field_2;
  response._M_string_length = 0;
  response.field_2._M_local_buf[0] = '\0';
  piVar7 = std::operator>>((istream *)
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl
                            )->read_from,(string *)&response);
  if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
    pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::operator+(&v,"asked lackey to ",&command);
    std::operator+(&k,&v,", but it gave no T/F");
    DisobedientLackeyError::DisobedientLackeyError(pDVar11,&k);
    __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  bVar3 = std::operator==(&response,"T");
  if ((!bVar3) && (bVar4 = std::operator==(&response,"F"), !bVar4)) {
    pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::operator+(&local_e0,"asked lackey to ",&command);
    std::operator+(&local_148,&local_e0," but it replied with \'");
    std::operator+(&local_128,&local_148,&operation);
    std::operator+(&local_190,&local_128,"\' then \'");
    std::operator+(&v,&local_190,&response);
    std::operator+(&k,&v,"\'");
    DisobedientLackeyError::DisobedientLackeyError(pDVar11,&k);
    __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  plVar8 = (long *)std::istream::operator>>
                             (&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                               _M_head_impl)->read_from,&n);
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
    pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_148,n);
    std::operator+(&local_128,"lackey replied with length \'",&local_148);
    std::operator+(&local_190,&local_128,"\' to ");
    std::operator+(&v,&local_190,&command);
    std::operator+(&k,&v," query");
    DisobedientLackeyError::DisobedientLackeyError(pDVar11,&k);
    __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  bVar4 = std::operator==(&command,"S");
  if (bVar4) {
    for (iVar12 = 0; iVar12 < n; iVar12 = iVar12 + 1) {
      k._M_dataplus._M_p = (pointer)&k.field_2;
      v._M_dataplus._M_p = (pointer)&v.field_2;
      k._M_string_length = 0;
      v._M_string_length = 0;
      k.field_2._M_local_buf[0] = '\0';
      v.field_2._M_local_buf[0] = '\0';
      piVar7 = std::operator>>((istream *)
                               &((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                _M_head_impl)->read_from,(string *)&k);
      piVar7 = std::operator>>(piVar7,(string *)&v);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&local_a0,iVar12);
        std::operator+(&local_e0,"lackey gave bad response pair ",&local_a0);
        std::operator+(&local_148,&local_e0," to ");
        std::operator+(&local_128,&local_148,&command);
        std::operator+(&local_190,&local_128," query");
        DisobedientLackeyError::DisobedientLackeyError(pDVar11,&local_190);
        __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                    DisobedientLackeyError::~DisobedientLackeyError);
      }
      std::__cxx11::string::~string((string *)&v);
      std::__cxx11::string::~string((string *)&k);
    }
  }
  else {
    bVar4 = std::operator==(&command,"C");
    if ((bVar4) || (bVar4 = std::operator==(&command,"P"), bVar4)) {
      for (iVar12 = 0; iVar12 < n; iVar12 = iVar12 + 1) {
        k._M_dataplus._M_p = (pointer)&k.field_2;
        v._M_dataplus._M_p = (pointer)&v.field_2;
        k._M_string_length = 0;
        v._M_string_length = 0;
        k.field_2._M_local_buf[0] = '\0';
        v.field_2._M_local_buf[0] = '\0';
        piVar7 = std::operator>>((istream *)
                                 &((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                  _M_head_impl)->read_from,(string *)&k);
        plVar8 = (long *)std::istream::operator>>(piVar7,&m_1);
        if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
          pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
          std::operator+(&local_60,"lackey gave bad response pair ",&k);
          std::operator+(&local_a0,&local_60," ");
          std::__cxx11::to_string(&local_80,m_1);
          std::operator+(&local_e0,&local_a0,&local_80);
          std::operator+(&local_148,&local_e0," to ");
          std::operator+(&local_128,&local_148,&command);
          std::operator+(&local_190,&local_128," query");
          DisobedientLackeyError::DisobedientLackeyError(pDVar11,&local_190);
          __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                      DisobedientLackeyError::~DisobedientLackeyError);
        }
        n_00._M_str = k._M_dataplus._M_p;
        n_00._M_len = k._M_string_length;
        oVar9 = InputGraph::vertex_from_name
                          (((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)
                           ->pattern_graph,n_00);
        for (iVar13 = 0; iVar13 < m_1; iVar13 = iVar13 + 1) {
          piVar7 = std::operator>>((istream *)
                                   &((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                    _M_head_impl)->read_from,(string *)&v);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
            pDVar11 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
            std::operator+(&local_60,"lackey gave bad response pair ",&k);
            std::operator+(&local_a0,&local_60," ");
            std::__cxx11::to_string(&local_80,m_1);
            std::operator+(&local_e0,&local_a0,&local_80);
            std::operator+(&local_148,&local_e0," to ");
            std::operator+(&local_128,&local_148,&command);
            std::operator+(&local_190,&local_128," query");
            DisobedientLackeyError::DisobedientLackeyError(pDVar11,&local_190);
            __cxa_throw(pDVar11,&DisobedientLackeyError::typeinfo,
                        DisobedientLackeyError::~DisobedientLackeyError);
          }
          if (((((deletion->super__Function_base)._M_manager != (_Manager_type)0x0) &&
               (n_01._M_str = v._M_dataplus._M_p, n_01._M_len = v._M_string_length,
               oVar10 = InputGraph::vertex_from_name
                                  (((this->_imp)._M_t.
                                    super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                    .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                   _M_head_impl)->target_graph,n_01),
               ((ulong)oVar9.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int> & 0x100000000) != 0)) &&
              (((ulong)oVar10.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int> & 0x100000000) != 0)) &&
             (bVar4 = std::function<bool_(int,_int)>::operator()
                                (deletion,oVar9.super__Optional_base<int,_true,_true>._M_payload.
                                          super__Optional_payload_base<int>._M_payload,
                                 oVar10.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>._M_payload), bVar4)) {
            plVar8 = &((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
                      number_of_deletions;
            *plVar8 = *plVar8 + 1;
          }
        }
        std::__cxx11::string::~string((string *)&v);
        std::__cxx11::string::~string((string *)&k);
      }
    }
  }
  std::__cxx11::string::~string((string *)&response);
  std::__cxx11::string::~string((string *)&operation);
  std::__cxx11::string::~string((string *)&command);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return bVar3;
}

Assistant:

auto Lackey::check_solution(
    const VertexToVertexMapping & m,
    bool partial,
    bool all_solutions,
    const function<auto(int, int)->bool> & deletion) -> bool
{
    unique_lock<mutex> lock{_imp->external_solver_mutex};
    ++_imp->number_of_calls;

    string command;
    if (partial) {
        if (deletion) {
            ++_imp->number_of_propagations;
            command = "P";
        }
        else {
            ++_imp->number_of_checks;
            command = "C";
        }
    }
    else {
        ++_imp->number_of_checks;
        if (all_solutions)
            command = "A";
        else
            command = "F";
    }

    _imp->send_to << command << " " << m.size();
    for (auto & [p, t] : m)
        _imp->send_to << " " << _imp->pattern_graph.vertex_name(p) << " " << _imp->target_graph.vertex_name(t);
    _imp->send_to << endl;

    if (! _imp->send_to)
        throw DisobedientLackeyError{"error giving lackey its orders"};

    string operation;
    if (! (_imp->read_from >> operation) || operation != command)
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it replied with '" + operation + "'"};

    bool result;
    string response;
    if (! (_imp->read_from >> response))
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it gave no T/F"};
    else if (response == "T")
        result = true;
    else if (response == "F")
        result = false;
    else
        throw DisobedientLackeyError{"asked lackey to " + command + " but it replied with '" + operation + "' then '" + response + "'"};

    int n;
    if (! (_imp->read_from >> n))
        throw DisobedientLackeyError{"lackey replied with length '" + to_string(n) + "' to " + command + " query"};

    if (command == "S") {
        for (int i = 0; i < n; ++i) {
            string k, v;
            if (! (_imp->read_from >> k >> v))
                throw DisobedientLackeyError{"lackey gave bad response pair " + to_string(i) + " to " + command + " query"};
        }
    }
    else if (command == "C" || command == "P") {
        for (int i = 0; i < n; ++i) {
            string k, v;
            int m;
            if (! (_imp->read_from >> k >> m))
                throw DisobedientLackeyError{"lackey gave bad response pair " + k + " " + to_string(m) + " to " + command + " query"};
            auto p = _imp->pattern_graph.vertex_from_name(k);

            for (int j = 0; j < m; ++j) {
                if (! (_imp->read_from >> v))
                    throw DisobedientLackeyError{"lackey gave bad response pair " + k + " " + to_string(m) + " to " + command + " query"};

                if (deletion) {
                    auto t = _imp->target_graph.vertex_from_name(v);
                    if (p && t)
                        if (deletion(*p, *t))
                            ++_imp->number_of_deletions;
                }
            }
        }
    }

    return result;
}